

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

int __thiscall
jpgd::jpeg_decoder_file_stream::open(jpeg_decoder_file_stream *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  
  if ((FILE *)this->m_pFile != (FILE *)0x0) {
    fclose((FILE *)this->m_pFile);
    this->m_pFile = (FILE *)0x0;
  }
  this->m_eof_flag = false;
  this->m_error_flag = false;
  pFVar1 = fopen(__file,"rb");
  this->m_pFile = (FILE *)pFVar1;
  return (int)CONCAT71((int7)((ulong)pFVar1 >> 8),pFVar1 != (FILE *)0x0);
}

Assistant:

bool jpeg_decoder_file_stream::open(const char* Pfilename) {
  close();

  m_eof_flag = false;
  m_error_flag = false;

#if defined(_MSC_VER)
  m_pFile = NULL;
  fopen_s(&m_pFile, Pfilename, "rb");
#else
  m_pFile = fopen(Pfilename, "rb");
#endif
  return m_pFile != NULL;
}